

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FboColorTexCubeArrayCase::render
          (FboColorTexCubeArrayCase *this,Surface *dst)

{
  ulong uVar1;
  deUint32 dVar2;
  uint uVar3;
  DataType DVar4;
  ContextType type;
  GLSLVersion glslVersion;
  deUint32 program;
  deUint32 program_00;
  int iVar5;
  int iVar6;
  int iVar7;
  value_type vVar8;
  CubeFace face_00;
  TestLog *this_00;
  char *str;
  CommandLine *this_01;
  DataTypes *samplerTypes;
  RenderContext *pRVar9;
  Context *pCVar10;
  MessageBuilder *pMVar11;
  int *piVar12;
  size_type sVar13;
  reference pvVar14;
  deUint32 *pdVar15;
  reference pvVar16;
  void *data_00;
  ContextWrapper *this_02;
  CubeFace face;
  int layer;
  undefined1 local_a10 [8];
  Vec3 p1;
  Vec3 p0;
  Vector<float,_3> local_9ec;
  PixelBufferAccess local_9e0;
  Vector<float,_4> local_9b8;
  Vec4 local_9a8;
  PixelBufferAccess local_998;
  TextureFormat local_970;
  undefined1 local_968 [8];
  TextureLevel data;
  IVec3 *viewport;
  deUint32 local_930;
  deUint32 fbo;
  deUint32 tmpTex;
  int texH;
  int texW;
  deUint32 dataType;
  deUint32 format;
  int layerFace;
  size_t ndx_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_908;
  ulong local_900;
  size_t n;
  undefined1 local_8f0 [8];
  vector<int,_std::allocator<int>_> order;
  deUint32 local_758;
  int local_754;
  deUint32 layerFbo;
  int ndx;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  MessageBuilder local_5c0;
  Vector<int,_3> *local_440;
  IVec3 *size;
  TextureFormat TStack_430;
  bool isFilterable;
  TransferFormat local_424;
  TransferFormat transferFmt;
  deUint32 tex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> fbos;
  deUint32 arrayTexShaderID;
  deUint32 texToFboShaderID;
  undefined1 local_3e8 [8];
  TextureCubeArrayShader arrayTexShader;
  DataTypes local_238;
  undefined1 local_220 [8];
  Texture2DShader texToFboShader;
  TextureFormatInfo fmtInfo;
  TextureFormat local_38;
  TextureFormat texFmt;
  Random rnd;
  TestLog *log;
  Surface *dst_local;
  FboColorTexCubeArrayCase *this_local;
  
  this_00 = tcu::TestContext::getLog
                      ((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  this_01 = tcu::TestContext::getCommandLine
                      ((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  uVar3 = tcu::CommandLine::getBaseSeed(this_01);
  de::Random::Random((Random *)&texFmt,dVar2 ^ uVar3 ^ 0xed607a89);
  local_38 = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo((TextureFormatInfo *)&texToFboShader.field_0x194,&local_38);
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_238);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_238,TYPE_SAMPLER_2D);
  DVar4 = FboTestUtil::getFragmentOutputType(&local_38);
  tcu::operator-((tcu *)(arrayTexShader.m_coordMat.m_data.m_data[2].m_data + 2),
                 (Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)&texToFboShader.field_0x194);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_220,samplerTypes,DVar4,
             (Vec4 *)(arrayTexShader.m_coordMat.m_data.m_data[2].m_data + 2),
             (Vec4 *)&texToFboShader.field_0x194);
  FboTestUtil::DataTypes::~DataTypes(&local_238);
  DVar4 = glu::getSamplerCubeArrayType(local_38);
  pRVar9 = gles31::Context::getRenderContext
                     ((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar9->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(type);
  FboTestUtil::TextureCubeArrayShader::TextureCubeArrayShader
            ((TextureCubeArrayShader *)local_3e8,DVar4,TYPE_FLOAT_VEC4,glslVersion);
  pCVar10 = sglr::ContextWrapper::getCurrentContext
                      (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  program = (*pCVar10->_vptr_Context[0x75])(pCVar10,local_220);
  pCVar10 = sglr::ContextWrapper::getCurrentContext
                      (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  program_00 = (*pCVar10->_vptr_Context[0x75])(pCVar10,local_3e8);
  pCVar10 = sglr::ContextWrapper::getCurrentContext
                      (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_220,pCVar10,program);
  FboTestUtil::TextureCubeArrayShader::setTexScaleBias
            ((TextureCubeArrayShader *)local_3e8,(Vec4 *)(fmtInfo.valueMax.m_data + 2),
             (Vec4 *)(fmtInfo.lookupScale.m_data + 2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType);
  TStack_430 = local_38;
  local_424 = glu::getTransferFormat(local_38);
  size._7_1_ = glu::isGLInternalColorFormatFilterable((this->super_FboColorbufferCase).m_format);
  local_440 = (Vector<int,_3> *)&(this->super_FboColorbufferCase).field_0x8c;
  tcu::TestLog::operator<<(&local_5c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (&local_5c0,(char (*) [36])"Creating a cube map array texture (");
  local_5c4 = tcu::Vector<int,_3>::x(local_440);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_5c4);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a9098a);
  local_5c8 = tcu::Vector<int,_3>::y(local_440);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_5c8);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [10])0x29bea78);
  local_5cc = tcu::Vector<int,_3>::z(local_440);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_5cc);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a94734);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5c0);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,
             &transferFmt.format);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x9009,
             transferFmt.format);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x9009,0x2802,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x9009,0x2803,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x9009,0x8072,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x9009,0x2801,
             size._7_1_ & 1 | 0x2600);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x9009,0x2800,
             size._7_1_ & 1 | 0x2600);
  dVar2 = (this->super_FboColorbufferCase).m_format;
  iVar5 = tcu::Vector<int,_3>::x(local_440);
  iVar6 = tcu::Vector<int,_3>::y(local_440);
  iVar7 = tcu::Vector<int,_3>::z(local_440);
  sglr::ContextWrapper::glTexImage3D
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x9009,0,dVar2
             ,iVar5,iVar6,iVar7,0,local_424.format,local_424.dataType,(void *)0x0);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&layerFbo,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&layerFbo,
                       (char (*) [50])"Creating a framebuffer object for each layer-face");
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&layerFbo);
  local_754 = 0;
  while( true ) {
    iVar5 = local_754;
    piVar12 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&(this->super_FboColorbufferCase).field_0x8c)
    ;
    if (*piVar12 <= iVar5) break;
    sglr::ContextWrapper::glGenFramebuffers
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,&local_758
              );
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               local_758);
    sglr::ContextWrapper::glFramebufferTextureLayer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               0x8ce0,transferFmt.format,0,local_754);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType,
               &local_758);
    local_754 = local_754 + 1;
  }
  tcu::TestLog::operator<<
            ((MessageBuilder *)
             &order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)
                       &order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (char (*) [57])"Rendering test images to layer-faces in randomized order");
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder
            ((MessageBuilder *)
             &order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType);
  std::allocator<int>::allocator((allocator<int> *)((long)&n + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_8f0,sVar13,(allocator<int> *)((long)&n + 7))
  ;
  std::allocator<int>::~allocator((allocator<int> *)((long)&n + 7));
  local_900 = 0;
  while( true ) {
    uVar1 = local_900;
    sVar13 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)local_8f0);
    if (sVar13 <= uVar1) break;
    vVar8 = (value_type)local_900;
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_8f0,local_900);
    *pvVar14 = vVar8;
    local_900 = local_900 + 1;
  }
  local_908._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_8f0);
  ndx_1 = (size_t)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)local_8f0);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&texFmt,local_908,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)ndx_1);
  _format = 0;
  while( true ) {
    uVar1 = _format;
    sVar13 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)local_8f0);
    if (sVar13 <= uVar1) break;
    pdVar15 = (deUint32 *)
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_8f0,_format);
    dataType = *pdVar15;
    texW = 0x1908;
    texH = 0x1401;
    tmpTex = 0x80;
    fbo = 0x80;
    local_930 = 0;
    pvVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &transferFmt.dataType,(long)(int)dataType);
    dVar2 = *pvVar16;
    data.m_data.m_cap = (size_t)&(this->super_FboColorbufferCase).field_0x8c;
    local_970 = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_968,&local_970,0x80,0x80,1);
    tcu::TextureLevel::getAccess(&local_998,(TextureLevel *)local_968);
    generateRandomColor((Functional *)&local_9a8,(Random *)&texFmt);
    tcu::Vector<float,_4>::Vector(&local_9b8,0.0);
    tcu::fillWithGrid(&local_998,8,&local_9a8,&local_9b8);
    sglr::ContextWrapper::glGenTextures
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,&local_930
              );
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
               local_930);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2802
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2803
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2801
               ,0x2601);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2800
               ,0x2601);
    tcu::TextureLevel::getAccess(&local_9e0,(TextureLevel *)local_968);
    data_00 = tcu::PixelBufferAccess::getDataPtr(&local_9e0);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0,
               0x1908,0x80,0x80,0,0x1908,0x1401,data_00);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,dVar2
              );
    iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)data.m_data.m_cap);
    iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)data.m_data.m_cap);
    sglr::ContextWrapper::glViewport
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0,0,iVar5,
               iVar6);
    pCVar10 = sglr::ContextWrapper::getCurrentContext
                        (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    tcu::Vector<float,_3>::Vector(&local_9ec,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(p0.m_data + 1),1.0,1.0,0.0);
    sglr::drawQuad(pCVar10,program,&local_9ec,(Vec3 *)(p0.m_data + 1));
    FboTestCase::checkError((FboTestCase *)this);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(p1.m_data + 1),(float)((uint)_format & 1) - 1.0,
               (float)(_format >> 1) - 1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&face,1.0,1.0,0.0);
    tcu::operator+((tcu *)local_a10,(Vector<float,_3> *)(p1.m_data + 1),(Vector<float,_3> *)&face);
    iVar5 = (int)dataType / 6;
    face_00 = getCubeFaceFromNdx((int)dataType % 6);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,0);
    this_02 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
    iVar6 = sglr::ContextWrapper::getWidth(this_02);
    iVar7 = sglr::ContextWrapper::getHeight
                      (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    sglr::ContextWrapper::glViewport(this_02,0,0,iVar6,iVar7);
    sglr::ContextWrapper::glActiveTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x84c0);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x9009,
               transferFmt.format);
    FboTestUtil::TextureCubeArrayShader::setLayer((TextureCubeArrayShader *)local_3e8,iVar5);
    FboTestUtil::TextureCubeArrayShader::setFace((TextureCubeArrayShader *)local_3e8,face_00);
    pCVar10 = sglr::ContextWrapper::getCurrentContext
                        (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    FboTestUtil::TextureCubeArrayShader::setUniforms
              ((TextureCubeArrayShader *)local_3e8,pCVar10,program_00);
    pCVar10 = sglr::ContextWrapper::getCurrentContext
                        (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    sglr::drawQuad(pCVar10,program_00,(Vec3 *)(p1.m_data + 1),(Vec3 *)local_a10);
    FboTestCase::checkError((FboTestCase *)this);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_968);
    _format = _format + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_8f0);
  iVar5 = sglr::ContextWrapper::getWidth
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  iVar6 = sglr::ContextWrapper::getHeight
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestCase::readPixels((FboTestCase *)this,dst,0,0,iVar5,iVar6);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType);
  FboTestUtil::TextureCubeArrayShader::~TextureCubeArrayShader((TextureCubeArrayShader *)local_3e8);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_220);
  de::Random::~Random((Random *)&texFmt);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		TestLog&				log					= m_testCtx.getLog();
		de::Random				rnd					(deStringHash(getName()) ^ 0xed607a89 ^ m_testCtx.getCommandLine().getBaseSeed());
		tcu::TextureFormat		texFmt				= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);

		Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt), fmtInfo.valueMax-fmtInfo.valueMin, fmtInfo.valueMin);
		TextureCubeArrayShader	arrayTexShader		(glu::getSamplerCubeArrayType(texFmt), glu::TYPE_FLOAT_VEC4, glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType()));

		deUint32				texToFboShaderID	= getCurrentContext()->createProgram(&texToFboShader);
		deUint32				arrayTexShaderID	= getCurrentContext()->createProgram(&arrayTexShader);

		// Setup textures
		texToFboShader.setUniforms(*getCurrentContext(), texToFboShaderID);
		arrayTexShader.setTexScaleBias(fmtInfo.lookupScale, fmtInfo.lookupBias);

		// Framebuffers.
		std::vector<deUint32>	fbos;
		deUint32				tex;

		{
			glu::TransferFormat	transferFmt		= glu::getTransferFormat(texFmt);
			bool				isFilterable	= glu::isGLInternalColorFormatFilterable(m_format);
			const IVec3&		size			= m_texSize;

			log << TestLog::Message
				<< "Creating a cube map array texture ("
				<< size.x() << "x" << size.y()
				<< ", depth: "
				<< size.z() << ")"
				<< TestLog::EndMessage;

			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, m_format, size.x(), size.y(), size.z(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			log << TestLog::Message << "Creating a framebuffer object for each layer-face" << TestLog::EndMessage;

			// Generate an FBO for each layer-face
			for (int ndx = 0; ndx < m_texSize.z(); ndx++)
			{
				deUint32 layerFbo;

				glGenFramebuffers(1, &layerFbo);
				glBindFramebuffer(GL_FRAMEBUFFER, layerFbo);
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, tex, 0, ndx);
				checkError();
				checkFramebufferStatus(GL_FRAMEBUFFER);

				fbos.push_back(layerFbo);
			}
		}

		log << TestLog::Message << "Rendering test images to layer-faces in randomized order" << TestLog::EndMessage;

		{
			std::vector<int> order(fbos.size());

			for (size_t n = 0; n < order.size(); n++)
				order[n] = (int)n;
			rnd.shuffle(order.begin(), order.end());

			for (size_t ndx = 0; ndx < order.size(); ndx++)
			{
				const int			layerFace	= order[ndx];
				const deUint32		format		= GL_RGBA;
				const deUint32		dataType	= GL_UNSIGNED_BYTE;
				const int			texW		= 128;
				const int			texH		= 128;
				deUint32			tmpTex		= 0;
				const deUint32		fbo			= fbos[layerFace];
				const IVec3&		viewport	= m_texSize;
				tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

				tcu::fillWithGrid(data.getAccess(), 8, generateRandomColor(rnd), Vec4(0.0f));

				glGenTextures(1, &tmpTex);
				glBindTexture(GL_TEXTURE_2D, tmpTex);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
				glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
				glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

				glBindFramebuffer(GL_FRAMEBUFFER, fbo);
				glViewport(0, 0, viewport.x(), viewport.y());
				sglr::drawQuad(*getCurrentContext(), texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
				checkError();

				// Render to framebuffer
				{
					const Vec3			p0		= Vec3(float(ndx % 2) - 1.0f, float(ndx / 2) - 1.0f, 0.0f);
					const Vec3			p1		= p0 + Vec3(1.0f, 1.0f, 0.0f);
					const int			layer	= layerFace / 6;
					const tcu::CubeFace	face	= getCubeFaceFromNdx(layerFace % 6);

					glBindFramebuffer(GL_FRAMEBUFFER, 0);
					glViewport(0, 0, getWidth(), getHeight());

					glActiveTexture(GL_TEXTURE0);
					glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);

					arrayTexShader.setLayer(layer);
					arrayTexShader.setFace(face);
					arrayTexShader.setUniforms(*getCurrentContext(), arrayTexShaderID);

					sglr::drawQuad(*getCurrentContext(), arrayTexShaderID, p0, p1);
					checkError();
				}
			}
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}